

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementUtilities.cpp
# Opt level: O1

bool Rml::ElementUtilities::PositionElement(Element *element,Vector2f offset,PositionAnchor anchor)

{
  Vector2f _content;
  Vector2f offset_00;
  Vector2f VVar1;
  Element *this;
  Box *this_00;
  ElementScroll *pEVar2;
  float fVar3;
  float fVar4;
  Box box;
  float local_98;
  float fStack_94;
  Vector2f local_88;
  float local_78;
  float fStack_74;
  Box local_60;
  
  this = Element::GetParentNode(element);
  if (this != (Element *)0x0) {
    this_00 = Element::GetBox(this);
    VVar1 = Box::GetSize(this_00);
    pEVar2 = Element::GetElementScroll(this);
    fVar3 = ElementScroll::GetScrollbarSize(pEVar2,VERTICAL);
    local_98 = VVar1.x;
    fStack_94 = VVar1.y;
    pEVar2 = Element::GetElementScroll(this);
    fVar4 = ElementScroll::GetScrollbarSize(pEVar2,HORIZONTAL);
    fStack_94 = fStack_94 - fVar4;
    Box::Box(&local_60);
    VVar1.y = fStack_94;
    VVar1.x = local_98 - fVar3;
    LayoutDetails::BuildBox(&local_60,VVar1,element,Block);
    VVar1 = Box::GetSize(&local_60);
    if (VVar1.y < 0.0) {
      VVar1 = Box::GetSize(&local_60);
      _content.y = fStack_94;
      _content.x = VVar1.x;
      Box::SetContent(&local_60,_content);
    }
    Element::SetBox(element,&local_60);
    VVar1 = Box::GetSize(&local_60,Margin);
    fStack_74 = offset.y;
    local_88 = offset;
    if ((anchor & RIGHT) != 0) {
      local_78 = offset.x;
      local_88.y = fStack_74;
      local_88.x = (local_98 - fVar3) - (VVar1.x + local_78);
    }
    if ((anchor & BOTTOM) != 0) {
      fVar3 = local_88.x;
      local_88.y = fStack_94 - (VVar1.y + fStack_74);
      local_88.x = fVar3;
    }
    VVar1 = Box::GetPosition(this_00,Content);
    fVar3 = Box::GetEdge(&local_60,Margin,Left);
    fVar4 = Box::GetEdge(&local_60,Margin,Top);
    local_98 = VVar1.x;
    fStack_94 = VVar1.y;
    offset_00.y = fStack_94 + local_88.y + fVar4;
    offset_00.x = local_98 + local_88.x + fVar3;
    Element::SetOffset(element,offset_00,this,false);
    Box::~Box(&local_60);
  }
  return this != (Element *)0x0;
}

Assistant:

bool ElementUtilities::PositionElement(Element* element, Vector2f offset, PositionAnchor anchor)
{
	Element* parent = element->GetParentNode();
	if (!parent)
		return false;

	const Box& parent_box = parent->GetBox();
	Vector2f containing_block = parent_box.GetSize();
	containing_block.x -= parent->GetElementScroll()->GetScrollbarSize(ElementScroll::VERTICAL);
	containing_block.y -= parent->GetElementScroll()->GetScrollbarSize(ElementScroll::HORIZONTAL);

	Box box;
	LayoutDetails::BuildBox(box, containing_block, element);
	if (box.GetSize().y < 0.f)
		box.SetContent(Vector2f(box.GetSize().x, containing_block.y));
	element->SetBox(box);

	Vector2f element_block = box.GetSize(BoxArea::Margin);
	Vector2f resolved_offset = offset;

	if (anchor & RIGHT)
		resolved_offset.x = containing_block.x - (element_block.x + offset.x);
	if (anchor & BOTTOM)
		resolved_offset.y = containing_block.y - (element_block.y + offset.y);

	// Position element relative to its parent.
	Vector2f relative_offset = parent_box.GetPosition(BoxArea::Content);
	relative_offset += resolved_offset;
	relative_offset.x += box.GetEdge(BoxArea::Margin, BoxEdge::Left);
	relative_offset.y += box.GetEdge(BoxArea::Margin, BoxEdge::Top);

	element->SetOffset(relative_offset, parent);

	return true;
}